

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  Pair *pPVar1;
  ImVector<ImGuiTabBar> *in_RDI;
  int idx;
  int n;
  int in_stack_fffffffffffffff0;
  int i;
  
  for (i = 0; i < in_RDI[1].Size; i = i + 1) {
    pPVar1 = ImVector<ImGuiStorage::Pair>::operator[]
                       ((ImVector<ImGuiStorage::Pair> *)(in_RDI + 1),i);
    in_stack_fffffffffffffff0 = (pPVar1->field_1).val_i;
    if (in_stack_fffffffffffffff0 != -1) {
      ImVector<ImGuiTabBar>::operator[](in_RDI,in_stack_fffffffffffffff0);
      ImGuiTabBar::~ImGuiTabBar((ImGuiTabBar *)0x15660b);
    }
  }
  ImGuiStorage::Clear((ImGuiStorage *)0x156627);
  ImVector<ImGuiTabBar>::clear((ImVector<ImGuiTabBar> *)CONCAT44(i,in_stack_fffffffffffffff0));
  in_RDI[2].Size = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Data[idx].~T(); }  Map.Clear(); Data.clear(); FreeIdx = 0; }